

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# search.cc
# Opt level: O3

void Search::add_example_conditioning
               (search_private *priv,example *ec,size_t condition_on_cnt,char *condition_on_names,
               action_repr *condition_on_actions)

{
  char cVar1;
  wclass *pwVar2;
  features *pfVar3;
  unsigned_long uVar4;
  example *peVar5;
  ostream *this;
  ostream *poVar6;
  uint32_t *puVar7;
  vw *pvVar8;
  float *pfVar9;
  size_t sVar10;
  float *pfVar11;
  long lVar12;
  ulong uVar13;
  ulong uVar14;
  action_repr *paVar15;
  size_t local_b8;
  undefined1 *local_b0 [2];
  undefined1 local_a0 [16];
  ostream *local_90;
  example *local_88;
  size_t local_80;
  char *local_78;
  action_repr *local_70;
  action_repr *local_68;
  stringstream *local_60;
  string *local_58;
  char *local_50;
  ulong local_48;
  long local_40;
  ulong local_38;
  
  if (condition_on_cnt != 0) {
    if ((priv->is_ldf == true) &&
       (pwVar2 = (ec->l).cs.costs._begin, (ec->l).cs.costs._end != pwVar2)) {
      local_48 = (ulong)(pwVar2->class_index * 0x3abb39);
    }
    else {
      local_48 = 0;
    }
    uVar14 = (priv->acset).max_bias_ngram_length;
    uVar13 = (priv->acset).max_quad_ngram_length;
    if (uVar13 < uVar14) {
      uVar13 = uVar14;
    }
    local_40 = local_48 * 0x81904f + 0x118fd;
    local_60 = &priv->dat_new_feature_audit_ss;
    local_58 = (string *)&priv->field_0x370;
    local_90 = (ostream *)&priv->field_0x368;
    local_b8 = 0;
    local_88 = ec;
    local_80 = condition_on_cnt;
    local_78 = condition_on_names;
    local_70 = condition_on_actions;
    local_68 = condition_on_actions;
    local_50 = condition_on_names;
    local_38 = uVar13;
    do {
      if (priv->all->audit == true) {
        local_b0[0] = local_a0;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_b0,"");
        std::__cxx11::stringbuf::str(local_58);
        if (local_b0[0] != local_a0) {
          operator_delete(local_b0[0]);
        }
        std::ios::clear((int)*(undefined8 *)(*(long *)&priv->dat_new_feature_audit_ss + -0x18) +
                        (int)local_60);
        priv->dat_new_feature_feature_space = (string *)&condition_feature_space_abi_cxx11_;
      }
      if (uVar13 != 0) {
        uVar14 = 0;
        lVar12 = local_40;
        paVar15 = local_68;
        do {
          if (local_80 <= local_b8 + uVar14) break;
          cVar1 = local_50[uVar14];
          lVar12 = ((long)cVar1 * 0x118fd + 0x284a40980b5) * (ulong)(paVar15->a + 0x553ad) +
                   lVar12 * 0x504c5;
          priv->dat_new_feature_ec = local_88;
          priv->dat_new_feature_idx = lVar12 * 0x1aa5cfd;
          priv->dat_new_feature_namespace = 0x86;
          priv->dat_new_feature_value = (priv->acset).feature_value;
          if (priv->all->audit == true) {
            if (uVar14 != 0) {
              local_b0[0] = (undefined1 *)CONCAT71(local_b0[0]._1_7_,0x2c);
              std::__ostream_insert<char,std::char_traits<char>>(local_90,(char *)local_b0,1);
            }
            poVar6 = local_90;
            if ((byte)(cVar1 - 0x21U) < 0x5e) {
              std::ostream::_M_insert<unsigned_long>((ulong)local_90);
            }
            else {
              local_b0[0] = (undefined1 *)CONCAT71(local_b0[0]._1_7_,0x23);
              this = std::__ostream_insert<char,std::char_traits<char>>(local_90,(char *)local_b0,1)
              ;
              poVar6 = local_90;
              std::ostream::operator<<(this,(int)cVar1);
            }
            local_b0[0] = (undefined1 *)CONCAT71(local_b0[0]._1_7_,0x3d);
            poVar6 = std::__ostream_insert<char,std::char_traits<char>>(poVar6,(char *)local_b0,1);
            std::ostream::_M_insert<unsigned_long>((ulong)poVar6);
            uVar13 = local_38;
          }
          if (uVar14 < (priv->acset).max_bias_ngram_length) {
            pvVar8 = priv->all;
            if ((pvVar8->weights).sparse == false) {
              puVar7 = &(pvVar8->weights).dense_weights._stride_shift;
            }
            else {
              puVar7 = &(pvVar8->weights).sparse_weights._stride_shift;
            }
            add_new_feature(priv,1.0,0x431c79L << ((byte)*puVar7 & 0x3f));
          }
          if (uVar14 < (priv->acset).max_quad_ngram_length) {
            GD::foreach_feature<Search::search_private,_unsigned_long,_&Search::add_new_feature>
                      (priv->all,local_88,priv);
          }
          uVar14 = uVar14 + 1;
          paVar15 = paVar15 + 1;
        } while (uVar13 != uVar14);
      }
      local_b8 = local_b8 + 1;
      local_50 = local_50 + 1;
      local_68 = local_68 + 1;
    } while (local_b8 != local_80);
    if ((priv->acset).use_passthrough_repr == true) {
      sVar10 = 0;
      do {
        pfVar3 = local_70[sVar10].repr;
        if (pfVar3 != (features *)0x0) {
          pfVar9 = (pfVar3->values)._begin;
          pfVar11 = (pfVar3->values)._end;
          if (pfVar11 != pfVar9) {
            lVar12 = ((long)local_78[sVar10] * 0x80107100000000 >> 0x20) + local_48;
            uVar14 = 0;
            do {
              if (1e-10 < ABS(pfVar9[uVar14])) {
                uVar4 = (pfVar3->indicies)._begin[uVar14];
                pvVar8 = priv->all;
                if (pvVar8->audit == true) {
                  local_b0[0] = local_a0;
                  std::__cxx11::string::_M_construct<char_const*>((string *)local_b0,"");
                  std::__cxx11::stringbuf::str(local_58);
                  if (local_b0[0] != local_a0) {
                    operator_delete(local_b0[0]);
                  }
                  std::ios::clear((int)*(undefined8 *)
                                        (*(long *)&priv->dat_new_feature_audit_ss + -0x18) +
                                  (int)local_60);
                  poVar6 = local_90;
                  std::__ostream_insert<char,std::char_traits<char>>
                            (local_90,"passthrough_repr_",0x11);
                  poVar6 = std::ostream::_M_insert<unsigned_long>((ulong)poVar6);
                  local_b0[0] = (undefined1 *)CONCAT71(local_b0[0]._1_7_,0x5f);
                  poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                                     (poVar6,(char *)local_b0,1);
                  std::ostream::_M_insert<unsigned_long>((ulong)poVar6);
                  pvVar8 = priv->all;
                }
                priv->dat_new_feature_ec = local_88;
                priv->dat_new_feature_idx = uVar4 * 0xcd1c9 + lVar12 * 0x2e2185b + 0xf4ed56e4;
                priv->dat_new_feature_namespace = 0x86;
                priv->dat_new_feature_value = (pfVar3->values)._begin[uVar14];
                puVar7 = &(pvVar8->weights).dense_weights._stride_shift;
                if ((pvVar8->weights).sparse != false) {
                  puVar7 = &(pvVar8->weights).sparse_weights._stride_shift;
                }
                add_new_feature(priv,1.0,0x431c79L << ((byte)*puVar7 & 0x3f));
                pfVar9 = (pfVar3->values)._begin;
                pfVar11 = (pfVar3->values)._end;
              }
              uVar14 = uVar14 + 1;
            } while (uVar14 < (ulong)((long)pfVar11 - (long)pfVar9 >> 2));
          }
        }
        sVar10 = sVar10 + 1;
      } while (sVar10 != local_80);
    }
    peVar5 = local_88;
    if (((local_88->super_example_predict).feature_space[0x86].values._end ==
         (local_88->super_example_predict).feature_space[0x86].values._begin) ||
       ((local_88->super_example_predict).feature_space[0x86].sum_feat_sq <= 0.0)) {
      features::clear((local_88->super_example_predict).feature_space + 0x86);
    }
    else {
      v_array<unsigned_char>::push_back((v_array<unsigned_char> *)local_88,&conditioning_namespace);
      peVar5->total_sum_feat_sq =
           (peVar5->super_example_predict).feature_space[0x86].sum_feat_sq +
           peVar5->total_sum_feat_sq;
      peVar5->num_features =
           peVar5->num_features +
           ((long)(peVar5->super_example_predict).feature_space[0x86].values._end -
            (long)(peVar5->super_example_predict).feature_space[0x86].values._begin >> 2);
    }
  }
  return;
}

Assistant:

void add_example_conditioning(search_private& priv, example& ec, size_t condition_on_cnt,
    const char* condition_on_names, action_repr* condition_on_actions)
{
  if (condition_on_cnt == 0)
    return;

  uint64_t extra_offset = 0;
  if (priv.is_ldf)
    if (ec.l.cs.costs.size() > 0)
      extra_offset = 3849017 * ec.l.cs.costs[0].class_index;

  size_t I = condition_on_cnt;
  size_t N = max(priv.acset.max_bias_ngram_length, priv.acset.max_quad_ngram_length);
  for (size_t i = 0; i < I; i++)  // position in conditioning
  {
    uint64_t fid = 71933 + 8491087 * extra_offset;
    if (priv.all->audit)
    {
      priv.dat_new_feature_audit_ss.str("");
      priv.dat_new_feature_audit_ss.clear();
      priv.dat_new_feature_feature_space = &condition_feature_space;
    }

    for (size_t n = 0; n < N; n++)  // length of ngram
    {
      if (i + n >= I)
        break;  // no more ngrams
      // we're going to add features for the ngram condition_on_actions[i .. i+N]
      uint64_t name = condition_on_names[i + n];
      fid = fid * 328901 + 71933 * ((condition_on_actions[i + n].a + 349101) * (name + 38490137));

      priv.dat_new_feature_ec = &ec;
      priv.dat_new_feature_idx = fid * quadratic_constant;
      priv.dat_new_feature_namespace = conditioning_namespace;
      priv.dat_new_feature_value = priv.acset.feature_value;

      if (priv.all->audit)
      {
        if (n > 0)
          priv.dat_new_feature_audit_ss << ',';
        if ((33 <= name) && (name <= 126))
          priv.dat_new_feature_audit_ss << name;
        else
          priv.dat_new_feature_audit_ss << '#' << (int)name;
        priv.dat_new_feature_audit_ss << '=' << condition_on_actions[i + n].a;
      }

      // add the single bias feature
      if (n < priv.acset.max_bias_ngram_length)
        add_new_feature(priv, 1., (uint64_t)4398201 << priv.all->weights.stride_shift());
      // add the quadratic features
      if (n < priv.acset.max_quad_ngram_length)
        GD::foreach_feature<search_private, uint64_t, add_new_feature>(*priv.all, ec, priv);
    }
  }

  if (priv.acset.use_passthrough_repr)
  {
    cdbg << "BEGIN adding passthrough features" << endl;
    for (size_t i = 0; i < I; i++)
    {
      if (condition_on_actions[i].repr == nullptr)
        continue;
      features& fs = *(condition_on_actions[i].repr);
      char name = condition_on_names[i];
      for (size_t k = 0; k < fs.size(); k++)
        if ((fs.values[k] > 1e-10) || (fs.values[k] < -1e-10))
        {
          uint64_t fid = 84913 + 48371803 * (extra_offset + 8392817 * name) + 840137 * (4891 + fs.indicies[k]);
          if (priv.all->audit)
          {
            priv.dat_new_feature_audit_ss.str("");
            priv.dat_new_feature_audit_ss.clear();
            priv.dat_new_feature_audit_ss << "passthrough_repr_" << i << '_' << k;
          }

          priv.dat_new_feature_ec = &ec;
          priv.dat_new_feature_idx = fid;
          priv.dat_new_feature_namespace = conditioning_namespace;
          priv.dat_new_feature_value = fs.values[k];
          add_new_feature(priv, 1., (uint64_t)4398201 << priv.all->weights.stride_shift());
        }
    }
    cdbg << "END adding passthrough features" << endl;
  }

  features& con_fs = ec.feature_space[conditioning_namespace];
  if ((con_fs.size() > 0) && (con_fs.sum_feat_sq > 0.))
  {
    ec.indices.push_back(conditioning_namespace);
    ec.total_sum_feat_sq += con_fs.sum_feat_sq;
    ec.num_features += con_fs.size();
  }
  else
    con_fs.clear();
}